

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O3

void __thiscall
Projection::set_outflow_bcs
          (Projection *this,int which_call,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Vel_in,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Divu_in,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Sig_in,int c_lev,int f_lev,
          int have_divu)

{
  int *piVar1;
  undefined8 *puVar2;
  ostringstream *this_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  IndexType IVar6;
  pointer pGVar7;
  byte bVar8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *pVVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  Box *outFaces_00;
  int iVar17;
  int dir;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  Box *state_strip_00;
  Orientation *outFacesAtThisLevel_00;
  int Divu;
  int Divu_Type;
  bool hasOutFlow;
  int numOutFlowFacesAtAllLevels;
  BoxArray uncovered_outflow_ba;
  Orientation outFaces [6];
  int icount [10];
  int numOutFlowFaces [10];
  Orientation outFacesAtThisLevel [10] [6];
  Box state_strip [10] [6];
  MultiFab *in_stack_fffffffffffff688;
  MultiFab *in_stack_fffffffffffff690;
  int in_stack_fffffffffffff6a0;
  int local_954 [3];
  undefined8 local_948;
  IndexType IStack_940;
  int iStack_93c;
  int local_938;
  int local_934;
  IndexType IStack_930;
  uint local_920;
  bool local_919;
  pointer local_918;
  IndexType IStack_910;
  int aiStack_90c [3];
  IndexType IStack_900;
  Box *local_8f0;
  Amr *local_8e8;
  uint local_8dc;
  int local_8d8;
  int local_8d4;
  Projection *local_8d0;
  long local_8c8;
  undefined1 local_8c0 [72];
  element_type *local_878;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_858;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_850;
  ulong local_848;
  uint local_840;
  Box local_838;
  undefined1 local_818 [32];
  undefined8 local_7f8;
  int aiStack_7e8 [12];
  Orientation local_7b8 [57];
  undefined8 uStack_6d4;
  undefined4 uStack_6cc;
  Print local_6c8 [4];
  
  local_920 = which_call;
  local_8d0 = this;
  local_850 = phi;
  if (verbose != 0) {
    local_6c8[0].os = amrex::OutStream();
    local_6c8[0].rank = *(int *)(DAT_00816950 + -0x30);
    this_00 = &local_6c8[0].ss;
    local_6c8[0].comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    *(undefined8 *)(&local_6c8[0].field_0x18 + *(long *)(local_6c8[0]._16_8_ + -0x18)) =
         *(undefined8 *)(local_6c8[0].os + *(long *)(*(long *)local_6c8[0].os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"...setting outflow bcs for the nodal projection ... ",0x34);
    local_7b8[0].val._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_7b8,1);
    amrex::Print::~Print(local_6c8);
  }
  outFaces_00 = &local_838;
  local_838.smallend.vect[0] = -1;
  local_838.smallend.vect[1] = -1;
  local_838.smallend.vect[2] = -1;
  local_838.bigend.vect[0] = -1;
  local_838.bigend.vect[1] = -1;
  local_838.bigend.vect[2] = -1;
  local_858 = Sig_in;
  memset(local_7b8,0xff,0xf0);
  OutFlowBC::GetOutFlowFaces(&local_919,(Orientation *)outFaces_00,local_8d0->phys_bc,&local_8d4);
  lVar15 = 0xc;
  do {
    *(undefined8 *)((long)&uStack_6d4 + lVar15) = 0x100000001;
    *(undefined4 *)((long)&uStack_6cc + lVar15) = 1;
    *(undefined1 (*) [16])((long)&local_6c8[0].rank + lVar15) = (undefined1  [16])0x0;
    lVar15 = lVar15 + 0x1c;
  } while (lVar15 != 0x69c);
  local_818._16_16_ = (undefined1  [16])0x0;
  local_818._0_16_ = (undefined1  [16])0x0;
  local_7f8 = 0;
  local_918 = (pointer)0x100000001;
  IStack_910.itype = 1;
  aiStack_90c[0] = 0;
  aiStack_90c[1] = 0;
  aiStack_90c[2] = 0;
  IStack_900.itype = 0;
  local_8c8 = (long)f_lev;
  if (0 < local_8d4) {
    local_8f0 = (Box *)0x0;
    iVar12 = local_8d4;
    do {
      if (c_lev <= f_lev) {
        uVar21 = local_838.smallend.vect[(long)local_8f0] % 3;
        lVar16 = (long)(int)uVar21;
        bVar8 = (byte)uVar21 & 0x1f;
        local_8dc = -2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8;
        local_8d8 = -1;
        lVar15 = local_8c8;
        do {
          local_8e8 = local_8d0->parent;
          pGVar7 = (local_8d0->parent->super_AmrCore).super_AmrMesh.geom.
                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar12 = *(int *)((long)(pGVar7 + lVar15) + 0xac);
          iVar17 = *(int *)((long)(pGVar7 + lVar15) + 0xb0);
          uVar3 = *(uint *)((long)(pGVar7 + lVar15) + 0xb4);
          iVar4 = *(int *)((long)(pGVar7 + lVar15) + 0xb8);
          iVar5 = *(int *)((long)(pGVar7 + lVar15) + 0xbc);
          iVar13 = *(int *)((long)(pGVar7 + lVar15) + 0xc0);
          IVar6.itype = *(uint *)((long)(pGVar7 + lVar15) + 0xc4);
          if (local_838.smallend.vect[(long)local_8f0] - 3U < 3) {
            local_948 = (pointer)CONCAT44(iVar17,iVar12);
            IStack_940.itype = uVar3;
            local_954[0] = iVar4;
            local_954[1] = iVar5;
            local_954[2] = iVar13;
            local_848 = CONCAT44(IVar6.itype >> 1,IVar6.itype) & 0x100000001;
            local_840 = IVar6.itype >> 2 & 1;
            iVar19 = local_954[lVar16];
            uVar18 = ~*(uint *)((long)&local_848 + lVar16 * 4) & 1;
            *(uint *)((long)&local_948 + lVar16 * 4) = uVar18 + iVar19;
            local_954[lVar16] = uVar18 + iVar19 + 1;
            local_8c0._8_4_ = IStack_940.itype;
            local_8c0._0_8_ = local_948;
            local_8c0._20_4_ = local_954[2];
            local_8c0._12_4_ = local_954[0];
            local_8c0._16_4_ = local_954[1];
            local_918 = local_948;
            IStack_910.itype = IStack_940.itype;
            aiStack_90c[0] = local_954[0];
            aiStack_90c[1] = local_954[1];
            aiStack_90c[2] = local_954[2];
            IStack_900.itype = IVar6.itype & local_8dc;
            iVar19 = -2;
          }
          else {
            local_948 = (pointer)CONCAT44(iVar17,iVar12);
            IStack_940.itype = uVar3;
            local_954[0] = iVar4;
            local_954[1] = iVar5;
            local_954[2] = iVar13;
            iVar19 = *(int *)((long)&local_948 + lVar16 * 4);
            *(int *)((long)&local_948 + lVar16 * 4) = iVar19 + -2;
            local_954[lVar16] = iVar19 + -1;
            local_8c0._8_4_ = IStack_940.itype;
            local_8c0._0_8_ = local_948;
            local_8c0._20_4_ = local_954[2];
            local_8c0._12_4_ = local_954[0];
            local_8c0._16_4_ = local_954[1];
            local_918 = local_948;
            IStack_910.itype = IStack_940.itype;
            aiStack_90c[0] = local_954[0];
            aiStack_90c[1] = local_954[1];
            aiStack_90c[2] = local_954[2];
            IStack_900.itype = IVar6.itype & local_8dc;
            iVar19 = 2;
          }
          piVar1 = (int *)((long)&local_918 + lVar16 * 4);
          local_918 = (pointer)local_8c0._0_8_;
          IStack_910.itype = local_8c0._8_4_;
          aiStack_90c[0] = local_954[0];
          aiStack_90c[1] = local_954[1];
          aiStack_90c[2] = local_954[2];
          local_8c0._12_4_ = local_954[0];
          local_8c0._16_4_ = local_954[1];
          local_8c0._20_4_ = local_954[2];
          *piVar1 = *piVar1 + iVar19;
          aiStack_90c[lVar16] = aiStack_90c[lVar16] + iVar19;
          uVar20 = 0;
          do {
            if (uVar21 != uVar20) {
              piVar1 = (int *)((long)&local_918 + uVar20 * 4);
              *piVar1 = *piVar1 + -1;
              aiStack_90c[uVar20] = aiStack_90c[uVar20] + 1;
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != 3);
          local_948._0_4_ = (int)local_918;
          local_948._4_4_ = (int)((ulong)local_918 >> 0x20);
          if (iVar12 < (int)local_948) {
            iVar12 = (int)local_948;
          }
          if (iVar17 < local_948._4_4_) {
            iVar17 = local_948._4_4_;
          }
          local_948._4_4_ = iVar17;
          local_948._0_4_ = iVar12;
          IStack_940.itype = uVar3;
          if ((int)uVar3 < (int)IStack_910.itype) {
            IStack_940.itype = IStack_910.itype;
          }
          iStack_93c = iVar4;
          if (aiStack_90c[0] < iVar4) {
            iStack_93c = aiStack_90c[0];
          }
          local_938 = iVar5;
          if (aiStack_90c[1] < iVar5) {
            local_938 = aiStack_90c[1];
          }
          if (aiStack_90c[2] < iVar13) {
            iVar13 = aiStack_90c[2];
          }
          IStack_930.itype = IStack_900.itype;
          local_934 = iVar13;
          amrex::complementIn((BoxArray *)local_8c0,(Box *)&local_948,
                              (BoxArray *)
                              ((long)(local_8e8->amr_level).
                                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     .
                                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t + 0xd8))
          ;
          if (((local_878->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish ==
               (local_878->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start) && (local_8d8 == -1)) {
            iVar12 = *(int *)(local_818 + lVar15 * 4);
            lVar14 = (long)iVar12;
            local_7b8[lVar15 * 6 + lVar14].val = local_838.smallend.vect[(long)local_8f0];
            puVar2 = (undefined8 *)((long)&local_6c8[0].os + lVar14 * 0x1c + lVar15 * 0xa8 + 4);
            *puVar2 = CONCAT44(aiStack_90c[1],aiStack_90c[0]);
            puVar2[1] = CONCAT44(IStack_900.itype,aiStack_90c[2]);
            *(pointer *)(&local_6c8[0].rank + lVar15 * 0x2a + lVar14 * 7) = local_918;
            *(ostream **)(&local_6c8[0].rank + lVar15 * 0x2a + lVar14 * 7 + 2) =
                 (ostream *)CONCAT44(aiStack_90c[0],IStack_910.itype);
            *(int *)(local_818 + lVar15 * 4) = iVar12 + 1;
            local_8d8 = (int)lVar15;
          }
          amrex::BoxArray::~BoxArray((BoxArray *)local_8c0);
          bVar10 = c_lev < lVar15;
          lVar15 = lVar15 + -1;
          iVar12 = local_8d4;
        } while (bVar10);
      }
      outFaces_00 = (Box *)((long)(local_8f0->smallend).vect + 1);
      local_8f0 = outFaces_00;
    } while ((long)outFaces_00 < (long)iVar12);
  }
  if (c_lev <= f_lev) {
    lVar15 = local_8c8 - (ulong)(uint)(f_lev - c_lev);
    outFaces_00 = (Box *)(local_818 + lVar15 * 4);
    memcpy(aiStack_7e8 + lVar15,outFaces_00,(ulong)(uint)(f_lev - c_lev) * 4 + 4);
  }
  pVVar9 = local_858;
  if ((local_920 == 0x3ec) || (local_920 == 0x3ea)) {
    local_8c0._0_8_ = local_8c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"divu","");
    outFaces_00 = (Box *)&local_948;
    bVar10 = amrex::AmrLevel::isStateVariable((string *)local_8c0,(int *)outFaces_00,local_954);
    if ((undefined1 *)local_8c0._0_8_ != local_8c0 + 0x10) {
      outFaces_00 = (Box *)(CONCAT44(local_8c0._20_4_,local_8c0._16_4_) + 1);
      operator_delete((void *)local_8c0._0_8_,(ulong)outFaces_00);
    }
    if (!bVar10) {
      amrex::Error_host("Projection::set_outflow_bcs: No divu.");
    }
  }
  local_8e8 = (Amr *)0x0;
  if ((local_920 & 0xfffffffd) == 0x3e9) {
    local_8e8 = (Amr *)NavierStokesBase::gravity;
    local_8c0._0_8_ = local_8c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"divu","");
    outFaces_00 = (Box *)&local_948;
    bVar11 = amrex::AmrLevel::isStateVariable((string *)local_8c0,(int *)outFaces_00,local_954);
    bVar10 = (double)local_8e8 == 0.0;
    if ((undefined1 *)local_8c0._0_8_ != local_8c0 + 0x10) {
      outFaces_00 = (Box *)(CONCAT44(local_8c0._20_4_,local_8c0._16_4_) + 1);
      operator_delete((void *)local_8c0._0_8_,(ulong)outFaces_00);
    }
    if (bVar10 && !bVar11) {
      amrex::Error_host("Projection::set_outflow_bcs: No divu or gravity.");
    }
  }
  if (c_lev <= f_lev) {
    lVar15 = (long)c_lev;
    state_strip_00 = (Box *)(&local_6c8[0].rank + lVar15 * 0x2a);
    outFacesAtThisLevel_00 = local_7b8 + lVar15 * 6;
    do {
      if (0 < aiStack_7e8[lVar15]) {
        set_outflow_bcs_at_level
                  (local_8d0,(int)outFaces_00,(int)lVar15,c_lev,state_strip_00,
                   outFacesAtThisLevel_00,aiStack_7e8[lVar15],local_850,in_stack_fffffffffffff688,
                   in_stack_fffffffffffff690,
                   (pVVar9->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar15],in_stack_fffffffffffff6a0,
                   (Real)local_8e8);
      }
      lVar15 = lVar15 + 1;
      state_strip_00 = state_strip_00 + 6;
      outFacesAtThisLevel_00 = outFacesAtThisLevel_00 + 6;
    } while (f_lev + 1 != (int)lVar15);
  }
  return;
}

Assistant:

void
Projection::set_outflow_bcs (int        which_call,
                             const Vector<MultiFab*>& phi,
                             const Vector<MultiFab*>& Vel_in,
                             const Vector<MultiFab*>& Divu_in,
                             const Vector<MultiFab*>& Sig_in,
                             int        c_lev,
                             int        f_lev,
                             int        have_divu)
{
    AMREX_ASSERT((which_call == INITIAL_VEL  ) ||
                 (which_call == INITIAL_PRESS) ||
                 (which_call == INITIAL_SYNC ) ||
                 (which_call == LEVEL_PROJ   ) );

    if (which_call != LEVEL_PROJ)
        AMREX_ASSERT(c_lev == 0);

    if (verbose)
      amrex::Print() << "...setting outflow bcs for the nodal projection ... " << '\n';

    bool        hasOutFlow;
    Orientation outFaces[2*AMREX_SPACEDIM];
    Orientation outFacesAtThisLevel[maxlev][2*AMREX_SPACEDIM];

    int fine_level[2*AMREX_SPACEDIM];

    int numOutFlowFacesAtAllLevels;
    int numOutFlowFaces[maxlev];
    OutFlowBC::GetOutFlowFaces(hasOutFlow,outFaces,phys_bc,numOutFlowFacesAtAllLevels);

    //
    // Get 2-wide cc box, state_strip, along interior of top.
    // Get 1-wide nc box, phi_strip  , along top.
    //
    const int ccStripWidth = 2;

//    const int nCompPhi    = 1;
//    const int srcCompVel  = Xvel;
//    const int srcCompDivu = 0;
//    const int   nCompVel  = AMREX_SPACEDIM;
//    const int   nCompDivu = 1;

    //
    // Determine the finest level such that the entire outflow face is covered
    // by boxes at this level (skip if doesnt touch, and bomb if only partially
    // covered).
    //
    Box state_strip[maxlev][2*AMREX_SPACEDIM];

    int icount[maxlev];
    for (int i=0; i < maxlev; i++) icount[i] = 0;

    //
    // This loop is only to define the number of outflow faces at each level.
    //
    Box temp_state_strip;
    for (int iface = 0; iface < numOutFlowFacesAtAllLevels; iface++)
    {
      const int outDir    = outFaces[iface].coordDir();

      fine_level[iface] = -1;
      for (int lev = f_lev; lev >= c_lev; lev--)
      {
        Box domain = parent->Geom(lev).Domain();

        if (outFaces[iface].faceDir() == Orientation::high)
        {
            temp_state_strip = amrex::adjCellHi(domain,outDir,ccStripWidth);
            temp_state_strip.shift(outDir,-ccStripWidth);
        }
        else
        {
            temp_state_strip = amrex::adjCellLo(domain,outDir,ccStripWidth);
            temp_state_strip.shift(outDir,ccStripWidth);
        }
        // Grow the box by one tangentially in order to get velocity bc's.
        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
          if (dir != outDir) temp_state_strip.grow(dir,1);

        const BoxArray& Lgrids               = parent->getLevel(lev).boxArray();
        const Box&      valid_state_strip    = temp_state_strip & domain;
        const BoxArray  uncovered_outflow_ba = amrex::complementIn(valid_state_strip,Lgrids);

        AMREX_ASSERT( !(uncovered_outflow_ba.size() &&
                     amrex::intersect(Lgrids,valid_state_strip).size()) );

        if ( !(uncovered_outflow_ba.size()) && fine_level[iface] == -1) {
            int ii = icount[lev];
            outFacesAtThisLevel[lev][ii] = outFaces[iface];
            state_strip[lev][ii] = temp_state_strip;
            fine_level[iface] = lev;
            icount[lev]++;
        }
      }
    }

    for (int lev = f_lev; lev >= c_lev; lev--) {
      numOutFlowFaces[lev] = icount[lev];
    }

    NavierStokesBase* ns0 = dynamic_cast<NavierStokesBase*>(LevelData[c_lev]);
    AMREX_ASSERT(!(ns0 == 0));

    int Divu_Type, Divu;
    Real gravity = 0;

    if (which_call == INITIAL_SYNC || which_call == INITIAL_VEL)
    {
      if (!LevelData[c_lev]->isStateVariable("divu", Divu_Type, Divu))
        amrex::Error("Projection::set_outflow_bcs: No divu.");
    }

    if (which_call == INITIAL_PRESS || which_call == LEVEL_PROJ)
    {
      gravity = ns0->getGravity();
      if (!LevelData[c_lev]->isStateVariable("divu", Divu_Type, Divu) &&
          (gravity == 0) )
        amrex::Error("Projection::set_outflow_bcs: No divu or gravity.");
    }

    for (int lev = c_lev; lev <= f_lev; lev++)
    {
      if (numOutFlowFaces[lev] > 0)
        set_outflow_bcs_at_level (which_call,lev,c_lev,
                                  state_strip[lev],
                                  outFacesAtThisLevel[lev],
                                  numOutFlowFaces[lev],
                                  phi,
                                  Vel_in[lev],
                                  Divu_in[lev],
                                  Sig_in[lev],
                                  have_divu,
                                  gravity);

    }

}